

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ricecomp.c
# Opt level: O2

int output_nbits(Buffer *buffer,int bits,int n)

{
  Buffer_t *pBVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  
  uVar5 = buffer->bitbuffer;
  iVar2 = buffer->bits_to_go;
  if (0x20 < iVar2 + n) {
    n = n - iVar2;
    uVar5 = uVar5 << ((byte)iVar2 & 0x1f) | bits >> ((byte)n & 0x1f) & output_nbits::mask[iVar2];
    pBVar1 = buffer->current;
    buffer->current = pBVar1 + 1;
    *pBVar1 = (Buffer_t)uVar5;
    iVar2 = 8;
  }
  uVar5 = bits & output_nbits::mask[n] | uVar5 << ((byte)n & 0x1f);
  iVar3 = n - iVar2;
  for (iVar4 = iVar2 - n; iVar4 < 1; iVar4 = iVar4 + 8) {
    iVar2 = (int)uVar5 >> ((byte)iVar3 & 0x1f);
    pBVar1 = buffer->current;
    buffer->current = pBVar1 + 1;
    *pBVar1 = (Buffer_t)iVar2;
    iVar3 = iVar3 + -8;
  }
  buffer->bitbuffer = uVar5;
  buffer->bits_to_go = iVar4;
  return iVar2;
}

Assistant:

static int output_nbits(Buffer *buffer, int bits, int n)
{
/* local copies */
int lbitbuffer;
int lbits_to_go;
    /* AND mask for the right-most n bits */
    static unsigned int mask[33] = 
         {0,
	  0x1,       0x3,       0x7,       0xf,       0x1f,       0x3f,       0x7f,       0xff,
	  0x1ff,     0x3ff,     0x7ff,     0xfff,     0x1fff,     0x3fff,     0x7fff,     0xffff,
	  0x1ffff,   0x3ffff,   0x7ffff,   0xfffff,   0x1fffff,   0x3fffff,   0x7fffff,   0xffffff,
	  0x1ffffff, 0x3ffffff, 0x7ffffff, 0xfffffff, 0x1fffffff, 0x3fffffff, 0x7fffffff, 0xffffffff};

    /*
     * insert bits at end of bitbuffer
     */
    lbitbuffer = buffer->bitbuffer;
    lbits_to_go = buffer->bits_to_go;
    if (lbits_to_go+n > 32) {
	/*
	 * special case for large n: put out the top lbits_to_go bits first
	 * note that 0 < lbits_to_go <= 8
	 */
	lbitbuffer <<= lbits_to_go;
/*	lbitbuffer |= (bits>>(n-lbits_to_go)) & ((1<<lbits_to_go)-1); */
	lbitbuffer |= (bits>>(n-lbits_to_go)) & *(mask+lbits_to_go);
	putcbuf(lbitbuffer & 0xff,buffer);
	n -= lbits_to_go;
	lbits_to_go = 8;
    }
    lbitbuffer <<= n;
/*    lbitbuffer |= ( bits & ((1<<n)-1) ); */
    lbitbuffer |= ( bits & *(mask+n) );
    lbits_to_go -= n;
    while (lbits_to_go <= 0) {
	/*
	 * bitbuffer full, put out top 8 bits
	 */
	putcbuf((lbitbuffer>>(-lbits_to_go)) & 0xff,buffer);
	lbits_to_go += 8;
    }
    buffer->bitbuffer = lbitbuffer;
    buffer->bits_to_go = lbits_to_go;
    return(0);
}